

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::SharedDtor(NearestNeighborsIndex *this)

{
  bool bVar1;
  NearestNeighborsIndex *this_local;
  
  bVar1 = has_IndexType(this);
  if (bVar1) {
    clear_IndexType(this);
  }
  bVar1 = has_DistanceFunction(this);
  if (bVar1) {
    clear_DistanceFunction(this);
  }
  return;
}

Assistant:

void NearestNeighborsIndex::SharedDtor() {
  if (has_IndexType()) {
    clear_IndexType();
  }
  if (has_DistanceFunction()) {
    clear_DistanceFunction();
  }
}